

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

EStatusCode __thiscall
AbstractContentContext::TJ
          (AbstractContentContext *this,GlyphUnicodeMappingListOrDoubleList *inStringsAndSpacing)

{
  GraphicStateStack *this_00;
  PDFUsedFont *this_01;
  size_t __n;
  EStatusCode EVar1;
  int iVar2;
  GraphicState *pGVar3;
  _Node *p_Var4;
  Trace *pTVar5;
  undefined4 extraout_var;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _List_node_base *p_Var9;
  bool writeAsCID;
  char formattingBuffer [5];
  StringOrDoubleList stringOrDoubleList;
  ObjectIDType fontObjectID;
  string fontName;
  GlyphUnicodeMappingListList stringsList;
  OutputStringBufferStream stringStream;
  UShortListList encodedCharachtersListsList;
  bool local_141;
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  Byte local_10d [5];
  _List_node_base *local_108;
  _List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  AbstractContentContext *local_e8;
  ObjectIDType local_e0;
  string local_d8;
  _List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  local_b8;
  string local_a0;
  string local_80;
  OutputStringBufferStream local_60;
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_48;
  
  this_00 = &this->mGraphicStack;
  pGVar3 = GraphicStateStack::GetCurrentState(this_00);
  this_01 = pGVar3->mFont;
  if (this_01 == (PDFUsedFont *)0x0) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::TJ, Cannot write text, no current font is defined");
    return eSuccess;
  }
  local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
  local_b8._M_impl._M_node._M_size = 0;
  p_Var7 = (inStringsAndSpacing->
           super__List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_b8._M_impl._M_node.super__List_node_base._M_prev =
       local_b8._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)inStringsAndSpacing) {
    do {
      if (*(char *)&p_Var7[3]._M_next == '\0') {
        p_Var4 = std::__cxx11::
                 list<std::__cxx11::list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>>,std::allocator<std::__cxx11::list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>>>>
                 ::
                 _M_create_node<std::__cxx11::list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>>const&>
                           ((list<std::__cxx11::list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>>,std::allocator<std::__cxx11::list<GlyphUnicodeMapping,std::allocator<GlyphUnicodeMapping>>>>
                             *)&local_b8,
                            (list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)
                            (p_Var7 + 1));
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        local_b8._M_impl._M_node._M_size = local_b8._M_impl._M_node._M_size + 1;
      }
      p_Var7 = (((_List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)inStringsAndSpacing);
  }
  local_48._M_impl._M_node._M_size = 0;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
  EVar1 = PDFUsedFont::EncodeStringsForShowing
                    (this_01,(GlyphUnicodeMappingListList *)&local_b8,&local_e0,
                     (UShortListList *)&local_48,&local_141);
  if (EVar1 != eSuccess) {
    pTVar5 = Trace::DefaultTrace();
    EVar1 = eFailure;
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::TJ, Unexepcted failure, cannot include characters for writing final representation"
                     );
    goto LAB_0019ad9e;
  }
  EVar1 = eSuccess;
  if ((local_48._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_48) ||
     (local_e0 == 0)) goto LAB_0019ad9e;
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFontMapping_abi_cxx11_
            (&local_d8,(ResourcesDictionary *)CONCAT44(extraout_var,iVar2),local_e0);
  pGVar3 = GraphicStateStack::GetCurrentState(this_00);
  __n = (pGVar3->mPlacedFontName)._M_string_length;
  if ((__n == local_d8._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((pGVar3->mPlacedFontName)._M_dataplus._M_p,local_d8._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    pGVar3 = GraphicStateStack::GetCurrentState(this_00);
    local_108 = (_List_node_base *)pGVar3->mPlacedFontSize;
    pGVar3 = GraphicStateStack::GetCurrentState(this_00);
    if (((double)local_108 != pGVar3->mFontSize) ||
       (NAN((double)local_108) || NAN(pGVar3->mFontSize))) goto LAB_0019ae6a;
  }
  else {
LAB_0019ae6a:
    pGVar3 = GraphicStateStack::GetCurrentState(this_00);
    TfLow(this,&local_d8,pGVar3->mFontSize);
  }
  OutputStringBufferStream::OutputStringBufferStream(&local_60);
  local_100._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100;
  local_100._M_impl._M_node._M_size = 0;
  p_Var7 = (inStringsAndSpacing->
           super__List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_100._M_impl._M_node.super__List_node_base._M_prev =
       local_100._M_impl._M_node.super__List_node_base._M_next;
  local_e8 = this;
  if (local_141 == false) {
    if (p_Var7 != (_List_node_base *)inStringsAndSpacing) {
      p_Var9 = local_48._M_impl._M_node.super__List_node_base._M_next;
      do {
        paVar8 = &local_140.SomeValue.field_2;
        if (*(char *)&p_Var7[3]._M_next == '\x01') {
          local_140.DoubleValue = (double)p_Var7[2]._M_prev;
          local_140.SomeValue._M_string_length = 0;
          local_140.SomeValue.field_2._M_local_buf[0] = '\0';
          local_140.IsDouble = true;
          local_140.SomeValue._M_dataplus._M_p = (pointer)paVar8;
          p_Var6 = (_List_node_base *)operator_new(0x40);
          p_Var6[1]._M_next = p_Var6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p == paVar8) {
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
            p_Var6[2]._M_prev = (_List_node_base *)local_140.SomeValue.field_2._8_8_;
          }
          else {
            p_Var6[1]._M_next = (_List_node_base *)local_140.SomeValue._M_dataplus._M_p;
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
          }
          p_Var6[1]._M_prev = (_List_node_base *)local_140.SomeValue._M_string_length;
          local_140.SomeValue._M_string_length = 0;
          local_140.SomeValue.field_2._M_local_buf[0] = '\0';
          *(bool *)&p_Var6[3]._M_prev = local_140.IsDouble;
          p_Var6[3]._M_next = (_List_node_base *)local_140.DoubleValue;
          local_140.SomeValue._M_dataplus._M_p = (pointer)paVar8;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          local_100._M_impl._M_node._M_size = local_100._M_impl._M_node._M_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p != paVar8) {
            operator_delete(local_140.SomeValue._M_dataplus._M_p,
                            CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                                     local_140.SomeValue.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          p_Var6 = p_Var9 + 1;
          local_108 = p_Var9;
          while (p_Var6 = p_Var6->_M_next, p_Var6 != p_Var9 + 1) {
            local_10d[0] = *(Byte *)&p_Var6[1]._M_next;
            OutputStringBufferStream::Write(&local_60,local_10d,1);
          }
          OutputStringBufferStream::ToString_abi_cxx11_(&local_a0,&local_60);
          SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SomethingOrDouble(&local_140,&local_a0);
          p_Var9 = local_108;
          paVar8 = &local_140.SomeValue.field_2;
          p_Var6 = (_List_node_base *)operator_new(0x40);
          p_Var6[1]._M_next = p_Var6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p == paVar8) {
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
            p_Var6[2]._M_prev = (_List_node_base *)local_140.SomeValue.field_2._8_8_;
          }
          else {
            p_Var6[1]._M_next = (_List_node_base *)local_140.SomeValue._M_dataplus._M_p;
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
          }
          p_Var6[1]._M_prev = (_List_node_base *)local_140.SomeValue._M_string_length;
          local_140.SomeValue._M_string_length = 0;
          local_140.SomeValue.field_2._M_local_buf[0] = '\0';
          *(bool *)&p_Var6[3]._M_prev = local_140.IsDouble;
          p_Var6[3]._M_next = (_List_node_base *)local_140.DoubleValue;
          local_140.SomeValue._M_dataplus._M_p = (pointer)paVar8;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          local_100._M_impl._M_node._M_size = local_100._M_impl._M_node._M_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p != paVar8) {
            operator_delete(local_140.SomeValue._M_dataplus._M_p,
                            CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                                     local_140.SomeValue.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          OutputStringBufferStream::Reset(&local_60);
          p_Var9 = (((_List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        }
        p_Var7 = p_Var7->_M_next;
      } while (p_Var7 != (_List_node_base *)inStringsAndSpacing);
    }
    TJLow(local_e8,(StringOrDoubleList *)&local_100);
  }
  else {
    if (p_Var7 != (_List_node_base *)inStringsAndSpacing) {
      p_Var9 = local_48._M_impl._M_node.super__List_node_base._M_next;
      do {
        paVar8 = &local_140.SomeValue.field_2;
        if (*(char *)&p_Var7[3]._M_next == '\x01') {
          local_140.DoubleValue = (double)(p_Var7 + 1)[1]._M_prev;
          local_140.SomeValue._M_string_length = 0;
          local_140.SomeValue.field_2._M_local_buf[0] = '\0';
          local_140.IsDouble = true;
          local_140.SomeValue._M_dataplus._M_p = (pointer)paVar8;
          p_Var6 = (_List_node_base *)operator_new(0x40);
          p_Var6[1]._M_next = p_Var6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p == paVar8) {
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
            p_Var6[2]._M_prev = (_List_node_base *)local_140.SomeValue.field_2._8_8_;
          }
          else {
            p_Var6[1]._M_next = (_List_node_base *)local_140.SomeValue._M_dataplus._M_p;
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
          }
          p_Var6[1]._M_prev = (_List_node_base *)local_140.SomeValue._M_string_length;
          local_140.SomeValue._M_string_length = 0;
          local_140.SomeValue.field_2._M_local_buf[0] = '\0';
          *(bool *)&p_Var6[3]._M_prev = local_140.IsDouble;
          p_Var6[3]._M_next = (_List_node_base *)local_140.DoubleValue;
          local_140.SomeValue._M_dataplus._M_p = (pointer)paVar8;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          local_100._M_impl._M_node._M_size = local_100._M_impl._M_node._M_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p != paVar8) {
            operator_delete(local_140.SomeValue._M_dataplus._M_p,
                            CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                                     local_140.SomeValue.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          p_Var6 = p_Var9 + 1;
          local_108 = p_Var9;
          while (p_Var6 = p_Var6->_M_next, p_Var6 != p_Var9 + 1) {
            local_10d[0] = *(Byte *)((long)&p_Var6[1]._M_next + 1);
            OutputStringBufferStream::Write(&local_60,local_10d,1);
            local_10d[0] = *(Byte *)&p_Var6[1]._M_next;
            OutputStringBufferStream::Write(&local_60,local_10d,1);
          }
          OutputStringBufferStream::ToString_abi_cxx11_(&local_80,&local_60);
          SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SomethingOrDouble(&local_140,&local_80);
          p_Var9 = local_108;
          paVar8 = &local_140.SomeValue.field_2;
          p_Var6 = (_List_node_base *)operator_new(0x40);
          p_Var6[1]._M_next = p_Var6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p == paVar8) {
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
            p_Var6[2]._M_prev = (_List_node_base *)local_140.SomeValue.field_2._8_8_;
          }
          else {
            p_Var6[1]._M_next = (_List_node_base *)local_140.SomeValue._M_dataplus._M_p;
            p_Var6[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                          local_140.SomeValue.field_2._M_local_buf[0]);
          }
          p_Var6[1]._M_prev = (_List_node_base *)local_140.SomeValue._M_string_length;
          local_140.SomeValue._M_string_length = 0;
          local_140.SomeValue.field_2._M_local_buf[0] = '\0';
          *(bool *)&p_Var6[3]._M_prev = local_140.IsDouble;
          p_Var6[3]._M_next = (_List_node_base *)local_140.DoubleValue;
          local_140.SomeValue._M_dataplus._M_p = (pointer)paVar8;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          local_100._M_impl._M_node._M_size = local_100._M_impl._M_node._M_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.SomeValue._M_dataplus._M_p != paVar8) {
            operator_delete(local_140.SomeValue._M_dataplus._M_p,
                            CONCAT71(local_140.SomeValue.field_2._M_allocated_capacity._1_7_,
                                     local_140.SomeValue.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          OutputStringBufferStream::Reset(&local_60);
          p_Var9 = (((_List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        }
        p_Var7 = (((_List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
                    *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var7 != (_List_node_base *)inStringsAndSpacing);
    }
    TJHexLow(local_e8,(StringOrDoubleList *)&local_100);
  }
  std::__cxx11::
  _List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&local_100);
  OutputStringBufferStream::~OutputStringBufferStream(&local_60);
  EVar1 = eSuccess;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
LAB_0019ad9e:
  std::__cxx11::
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::_M_clear(&local_48);
  std::__cxx11::
  _List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ::_M_clear(&local_b8);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::TJ(const GlyphUnicodeMappingListOrDoubleList& inStringsAndSpacing)
{
	PDFUsedFont* currentFont = GetCurrentFont();
	if(!currentFont)
	{
		TRACE_LOG("AbstractContentContext::TJ, Cannot write text, no current font is defined");
		return PDFHummus::eSuccess;
	}

	// TJ is a bit different. i want to encode all strings in the array to the same font, so that at most a single
	// Tf is used...and command may be written as is. for that we need to encode all strings at once...which requires
	// a slightly different algorithm

	// first, list all the strings, so that you can encode them
	GlyphUnicodeMappingListList stringsList;
	GlyphUnicodeMappingListOrDoubleList::const_iterator it = inStringsAndSpacing.begin();
	
	for(; it != inStringsAndSpacing.end(); ++it)
		if(!it->IsDouble)
			stringsList.push_back(it->SomeValue);

	// now, encode all strings at once

	ObjectIDType fontObjectID;
	UShortListList encodedCharachtersListsList;
	bool writeAsCID;	

	if(currentFont->EncodeStringsForShowing(stringsList,fontObjectID,encodedCharachtersListsList,writeAsCID)!= PDFHummus::eSuccess)
	{
		TRACE_LOG("AbstractContentContext::TJ, Unexepcted failure, cannot include characters for writing final representation");
		return PDFHummus::eFailure;
	}
	
	// skip if there's no text going to be written (also means no font ID)
	if(encodedCharachtersListsList.empty() || 0 == fontObjectID)
		return PDFHummus::eSuccess;

	// status only returns if strings can be coded or not. so continue with writing regardless

	// Write the font reference (only if required)
	std::string fontName = GetResourcesDictionary()->AddFontMapping(fontObjectID);

	if(mGraphicStack.GetCurrentState().mPlacedFontName != fontName ||
		mGraphicStack.GetCurrentState().mPlacedFontSize != mGraphicStack.GetCurrentState().mFontSize)
		TfLow(fontName,mGraphicStack.GetCurrentState().mFontSize);
	
	// Now write the string using the text command
	OutputStringBufferStream stringStream;
	char formattingBuffer[5];
	StringOrDoubleList stringOrDoubleList;
	UShortListList::iterator itEncodedList = encodedCharachtersListsList.begin();
	UShortList::iterator itEncoded;

	if(writeAsCID)
	{
		for(it = inStringsAndSpacing.begin(); it != inStringsAndSpacing.end(); ++it)
		{
			if(it->IsDouble)
			{
				stringOrDoubleList.push_back(StringOrDouble(it->DoubleValue));
			}
			else
			{
				for(itEncoded = itEncodedList->begin();itEncoded!= itEncodedList->end();++itEncoded)
				{
					formattingBuffer[0] = ((*itEncoded) >> 8) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer, 1);
					formattingBuffer[0] = (*itEncoded) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer, 1);					
				}
				stringOrDoubleList.push_back(StringOrDouble(stringStream.ToString()));
				stringStream.Reset();
				++itEncodedList;
			}
		}
		TJHexLow(stringOrDoubleList);
	}
	else
	{

		for(it = inStringsAndSpacing.begin(); it != inStringsAndSpacing.end(); ++it)
		{
			if(it->IsDouble)
			{
				stringOrDoubleList.push_back(StringOrDouble(it->DoubleValue));
			}
			else
			{
				for(itEncoded = itEncodedList->begin();itEncoded!= itEncodedList->end();++itEncoded)
				{
					formattingBuffer[0] = (*itEncoded) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer,1);
				}
				stringOrDoubleList.push_back(StringOrDouble(stringStream.ToString()));
				stringStream.Reset();
				++itEncodedList;
			}
		}
		TJLow(stringOrDoubleList);
	}
	return PDFHummus::eSuccess;	
}